

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O3

int pfx_table_del_elem(node_data *data,uint index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined3 uVar7;
  rtr_socket *prVar8;
  undefined8 uVar9;
  int iVar10;
  ulong uVar11;
  data_elem *pdVar12;
  long lVar13;
  uint uVar14;
  long in_FS_OFFSET;
  data_elem deleted_elem;
  uint32_t local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uVar6;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = (ulong)index;
  lVar13 = uVar11 * 0x10;
  pdVar12 = data->ary + uVar11;
  uVar4 = pdVar12->asn;
  uVar5 = pdVar12->max_len;
  uVar7 = *(undefined3 *)&pdVar12->field_0x5;
  uVar6 = CONCAT31(uVar7,uVar5);
  prVar8 = pdVar12->socket;
  uVar14 = data->len;
  if (index < uVar14 - 1) {
    do {
      uVar11 = uVar11 + 1;
      puVar1 = (undefined8 *)((long)&data->ary[1].asn + lVar13);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&data->ary->asn + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      uVar14 = data->len;
      lVar13 = lVar13 + 0x10;
    } while (uVar11 < uVar14 - 1);
  }
  uVar14 = uVar14 - 1;
  data->len = uVar14;
  if (uVar14 == 0) {
    lrtr_free(data->ary);
    data->ary = (data_elem *)0x0;
  }
  else {
    pdVar12 = (data_elem *)lrtr_realloc(data->ary,(ulong)uVar14 << 4);
    if (pdVar12 == (data_elem *)0x0) {
      uStack_20 = SUB84(prVar8,0);
      uStack_1c = (undefined4)((ulong)prVar8 >> 0x20);
      pdVar12 = data->ary + data->len;
      pdVar12->asn = uVar4;
      *(undefined4 *)&pdVar12->max_len = uVar6;
      *(undefined4 *)&pdVar12->socket = uStack_20;
      *(undefined4 *)((long)&pdVar12->socket + 4) = uStack_1c;
      data->len = data->len + 1;
      iVar10 = -1;
      goto LAB_0010825f;
    }
    data->ary = pdVar12;
  }
  iVar10 = 0;
LAB_0010825f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

int pfx_table_del_elem(struct node_data *data, const unsigned int index)
{
	struct data_elem *tmp;
	struct data_elem deleted_elem = data->ary[index];

	// if index is not the last elem in the list, move all other elems backwards in the array
	if (index != data->len - 1) {
		for (unsigned int i = index; i < data->len - 1; i++)
			data->ary[i] = data->ary[i + 1];
	}

	data->len--;
	if (!data->len) {
		lrtr_free(data->ary);
		data->ary = NULL;
		return PFX_SUCCESS;
	}

	tmp = lrtr_realloc(data->ary, sizeof(struct data_elem) * data->len);
	if (!tmp) {
		data->ary[data->len] = deleted_elem;
		data->len++;
		return PFX_ERROR;
	}

	data->ary = tmp;

	return PFX_SUCCESS;
}